

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

Time __thiscall helics::FederateState::nextMessageTime(FederateState *this)

{
  shared_mutex *__rwlock;
  pointer puVar1;
  Time TVar2;
  long lVar3;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *endpoint;
  pointer puVar4;
  Time TVar5;
  
  lVar3 = 0x7fffffffffffffff;
  __rwlock = &(this->interfaceInformation).endpoints.m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar4 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = *(pointer *)
            ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar4 == puVar1) {
    lVar3 = 0x7fffffffffffffff;
  }
  else {
    do {
      TVar2 = EndpointInfo::firstMessageTime
                        ((puVar4->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
      TVar5.internalTimeCode = (this->time_granted).internalTimeCode;
      if (TVar5.internalTimeCode < TVar2.internalTimeCode) {
        TVar5 = TVar2;
      }
      if (lVar3 <= TVar5.internalTimeCode) {
        TVar5.internalTimeCode = lVar3;
      }
      lVar3 = TVar5.internalTimeCode;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (Time)lVar3;
}

Assistant:

Time FederateState::nextMessageTime() const
{
    auto firstMessageTime = Time::maxVal();
    for (const auto& endpoint : interfaceInformation.getEndpoints()) {
        auto messageTime = endpoint->firstMessageTime();
        if (messageTime < time_granted) {
            messageTime = time_granted;
        }
        if (messageTime < firstMessageTime) {
            firstMessageTime = messageTime;
        }
    }
    return firstMessageTime;
}